

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O1

int __thiscall
METADemuxer::addStream
          (METADemuxer *this,string *codec,string *codecStreamName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *addParams)

{
  pointer *pppFVar1;
  uint *puVar2;
  ContainerToReaderWrapper *this_00;
  pointer pMVar3;
  size_t __n;
  iterator __position;
  pointer pSVar4;
  int iVar5;
  bool bVar6;
  undefined8 uVar7;
  string *psVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int32_t iVar12;
  const_iterator cVar13;
  undefined4 extraout_var;
  long *plVar14;
  undefined8 *puVar15;
  iterator iVar16;
  iterator iVar17;
  pointer pMVar18;
  long lVar19;
  long lVar20;
  undefined4 *puVar21;
  ulong *puVar22;
  string *codecStreamName_00;
  string *fileName_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  pointer pMVar24;
  undefined8 uVar25;
  int64_t *piVar26;
  ContainerToReaderWrapper *pCVar27;
  BufferedReader *this_01;
  pointer pcVar28;
  pointer pbVar29;
  ulong uVar30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  bool bVar32;
  int32_t pid;
  bool isSubStream;
  string tmpname;
  AbstractStreamReader *codecReader;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileList;
  AbstractReader *dataReader;
  FileListIterator *listIterator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mplsNames;
  vector<MPLSParser,_std::allocator<MPLSParser>_> mplsInfoList;
  MPLSStreamInfo streamInfo;
  string unquotedStreamName;
  string fileExt;
  int32_t local_590;
  bool local_589;
  undefined1 local_588 [16];
  undefined1 local_578 [128];
  string local_4f8;
  pointer local_4d8;
  pointer local_4d0;
  _Base_ptr local_4c8;
  string local_4c0;
  string *local_4a0;
  string local_498;
  undefined1 local_478 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  long local_448 [2];
  vector<MPLSParser,_std::allocator<MPLSParser>_> local_438;
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408 [3];
  bool local_3d6;
  uint local_3d4;
  MPLSStreamInfo *local_3d0;
  MPLSStreamInfo *local_3c8;
  string local_2a0;
  string local_280;
  uint *local_260;
  undefined8 local_258;
  uint local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  uint *local_240;
  undefined8 local_238;
  uint local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  uint *local_220;
  undefined8 local_218;
  uint local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  uint *local_200;
  undefined8 local_1f8;
  uint local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  uint *local_1e0;
  undefined8 local_1d8;
  uint local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  uint *local_1c0;
  undefined8 local_1b8;
  uint local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  uint *local_1a0;
  undefined8 local_198;
  uint local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  uint *local_180;
  undefined8 local_178;
  uint local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  string local_160;
  string *local_140;
  _Base_ptr local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  key_type local_70;
  string local_50;
  
  local_590 = 0;
  local_578._40_8_ = this;
  local_4a0 = codec;
  local_418._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"track","");
  local_578._48_8_ = addParams;
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._0_8_ != local_408) {
    operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
  }
  local_4c8 = (_Base_ptr)(local_578._48_8_ + 8);
  if (cVar13._M_node != local_4c8) {
    local_590 = strToInt32(*(char **)(cVar13._M_node + 2));
  }
  local_418._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"subTrack","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_578._48_8_,(key_type *)local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._0_8_ != local_408) {
    operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
  }
  iVar12 = local_590;
  if (cVar13._M_node != local_4c8) {
    local_590 = strToInt32((string *)(cVar13._M_node + 2));
    local_590 = iVar12 * 0x10000 + local_590;
  }
  local_578._64_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_578._72_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_578._80_8_ = (pointer)0x0;
  unquoteStr(&local_160,codecStreamName);
  extractFileExt((string *)local_418,codecStreamName);
  psVar8 = local_4a0;
  strToLowerCase(&local_50,(string *)local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._0_8_ != local_408) {
    operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
  }
  local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = psVar8->_M_string_length;
  if (__n == ::h264DepCodecInfo.programName._M_string_length) {
    if (__n == 0) {
      bVar32 = true;
    }
    else {
      iVar11 = bcmp((psVar8->_M_dataplus)._M_p,::h264DepCodecInfo.programName._M_dataplus._M_p,__n);
      bVar32 = iVar11 == 0;
    }
  }
  else {
    bVar32 = false;
  }
  local_589 = true;
  if (!bVar32) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"subClip","");
    cVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_578._48_8_,&local_70);
    local_589 = cVar13._M_node != local_4c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  iVar11 = std::__cxx11::string::compare((char *)&local_50);
  local_140 = codecStreamName;
  if (iVar11 == 0) {
LAB_001a4786:
    getMplsInfo((vector<MPLSParser,_std::allocator<MPLSParser>_> *)local_588,
                (METADemuxer *)local_578._40_8_,codecStreamName);
    local_408[0]._0_8_ =
         local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_418._8_8_ =
         local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_418._0_8_ =
         local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_588._0_8_;
    local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_588._8_8_;
    local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_578._0_8_;
    local_588._0_8_ = (pointer)0x0;
    local_588._8_8_ = (pointer)0x0;
    local_578._0_8_ = (pointer)0x0;
    std::vector<MPLSParser,_std::allocator<MPLSParser>_>::~vector
              ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)local_418);
    std::vector<MPLSParser,_std::allocator<MPLSParser>_>::~vector
              ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)local_588);
    splitQuotedStr_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_478,(codecStreamName->_M_dataplus)._M_p,'+');
    if (local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_578._120_4_ = 0xffffffff;
      local_578._116_4_ = 0xff;
      local_4d8 = (pointer)0x0;
      local_578._124_4_ = ~TopLeft;
    }
    else {
      local_578._116_4_ = 0xff;
      local_578._124_4_ = ~TopLeft;
      local_4d8 = (pointer)0x0;
      local_578._120_4_ = 0xffffffff;
      pbVar29 = (pointer)0x0;
      do {
        pMVar24 = local_438.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
                  super__Vector_impl_data._M_start;
        unquoteStr((string *)local_418,(string *)(local_478._0_8_ + (long)pbVar29 * 0x20));
        std::__cxx11::string::operator=((string *)&local_160,(string *)local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._0_8_ != local_408) {
          operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
        }
        paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)pMVar24 + (long)pbVar29 * 0xb * 0x10);
        local_4d0 = pbVar29;
        if (*(long *)(paVar31->_M_local_buf + 0x28) != *(long *)(paVar31->_M_local_buf + 0x20)) {
          lVar19 = 8;
          uVar30 = 0;
          do {
            local_588._0_8_ = local_578;
            local_588._8_8_ = (pointer)0x0;
            local_578._0_8_ = local_578._0_8_ & 0xffffffffffffff00;
            if (local_589 == true) {
              if (*(long *)(paVar31->_M_local_buf + 0x98) == *(long *)(paVar31->_M_local_buf + 0xa0)
                 ) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_418,
                           "Current playlist file doesn\'t has MVC track info. Please, remove MVC track from the track list"
                           ,0x5e);
                puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
                std::__cxx11::stringbuf::str();
                *puVar21 = 0x1f6;
                *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
                if (local_180 == &local_170) {
                  puVar21[6] = local_170;
                  puVar21[7] = uStack_16c;
                  puVar21[8] = uStack_168;
                  puVar21[9] = uStack_164;
                }
                else {
                  *(uint **)(puVar21 + 2) = local_180;
                  *(ulong *)(puVar21 + 6) = CONCAT44(uStack_16c,local_170);
                }
                *(undefined8 *)(puVar21 + 4) = local_178;
                local_178 = 0;
                local_170 = local_170 & 0xffffff00;
                local_180 = &local_170;
                __cxa_throw(puVar21,&VodCoreException::typeinfo,VodCoreException::~VodCoreException)
                ;
              }
              if ((ulong)(*(long *)(paVar31->_M_local_buf + 0xa0) -
                          *(long *)(paVar31->_M_local_buf + 0x98) >> 5) <= uVar30) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_418,
                           "Bad playlist file: number of CLPI files for AVC and VMC parts do not match"
                           ,0x4a);
                puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
                std::__cxx11::stringbuf::str();
                *puVar21 = 0x1f6;
                *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
                if (local_1a0 == &local_190) {
                  puVar21[6] = local_190;
                  puVar21[7] = uStack_18c;
                  puVar21[8] = uStack_188;
                  puVar21[9] = uStack_184;
                }
                else {
                  *(uint **)(puVar21 + 2) = local_1a0;
                  *(ulong *)(puVar21 + 6) = CONCAT44(uStack_18c,local_190);
                }
                *(undefined8 *)(puVar21 + 4) = local_198;
                local_198 = 0;
                local_190 = local_190 & 0xffffff00;
                local_1a0 = &local_190;
                __cxa_throw(puVar21,&VodCoreException::typeinfo,VodCoreException::~VodCoreException)
                ;
              }
            }
            std::__cxx11::string::_M_assign((string *)local_588);
            mplsTrackToFullName((string *)local_418,&local_160,(string *)local_588);
            if ((paVar31->_M_local_buf[0x84] == '\x01') &&
               (bVar32 = fileExists((string *)local_418), !bVar32)) {
              mplsTrackToSSIFName(&local_4f8,&local_160,
                                  (string *)(*(long *)(paVar31->_M_local_buf + 0x20) + lVar19));
              std::__cxx11::string::operator=((string *)local_418,(string *)&local_4f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                operator_delete(local_4f8._M_dataplus._M_p,
                                local_4f8.field_2._M_allocated_capacity + 1);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_578 + 0x40),(value_type *)local_418);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._0_8_ != local_408) {
              operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
            }
            if ((pointer)local_588._0_8_ != (pointer)local_578) {
              operator_delete((void *)local_588._0_8_,(ulong)(local_578._0_8_ + 1));
            }
            uVar30 = uVar30 + 1;
            lVar19 = lVar19 + 0x30;
          } while (uVar30 < (ulong)((*(long *)(paVar31->_M_local_buf + 0x28) -
                                     *(long *)(paVar31->_M_local_buf + 0x20) >> 4) *
                                   -0x5555555555555555));
        }
        MPLSParser::getStreamByPID((MPLSStreamInfo *)local_418,(MPLSParser *)paVar31,local_590);
        psVar8 = local_4a0;
        uVar25 = local_578._48_8_;
        uVar7 = local_578._40_8_;
        if ((local_418._4_4_ == SUB_PGS) && (local_3d6 == true)) {
          local_578._124_4_ =
               addPGSubStream((METADemuxer *)local_578._40_8_,local_4a0,&local_160,
                              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_578._48_8_,local_3d0);
          local_578._120_4_ =
               addPGSubStream((METADemuxer *)uVar7,psVar8,&local_160,
                              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)uVar25,local_3c8);
          local_4d8 = (pointer)CONCAT71((int7)(CONCAT44(extraout_var,local_578._120_4_) >> 8),
                                        local_3d6);
          local_578._116_4_ = local_3d4;
        }
        pbVar29 = local_4d0;
        MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)local_418);
        pbVar29 = (pointer)&(((_Rep_type *)&pbVar29->_M_dataplus)->_M_impl).field_0x1;
      } while (pbVar29 < (undefined1 *)
                         (((long)local_438.
                                 super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                           (long)local_438.
                                 super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl
                                 .super__Vector_impl_data._M_start >> 4) * 0x2e8ba2e8ba2e8ba3));
      local_4d8 = (pointer)((ulong)local_4d8 & 0xffffffffffffff01);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_478);
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar11 == 0) goto LAB_001a4786;
    extractFileList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_588,codecStreamName);
    local_408[0]._0_8_ = local_578._80_8_;
    local_418._8_8_ = local_578._72_8_;
    local_418._0_8_ = local_578._64_8_;
    local_578._64_8_ = local_588._0_8_;
    local_578._72_8_ = local_588._8_8_;
    local_578._80_8_ = local_578._0_8_;
    local_588._0_8_ = (pointer)0x0;
    local_588._8_8_ = (pointer)0x0;
    local_578._0_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_418);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_588);
    local_578._120_4_ = 0xffffffff;
    local_578._116_4_ = 0xff;
    local_4d8 = (pointer)0x0;
    local_578._124_4_ = ~TopLeft;
  }
  iVar5 = (int)((ulong)(local_578._72_8_ - local_578._64_8_) >> 5);
  iVar11 = iVar5 + -1;
  local_280._M_dataplus._M_p._0_4_ = iVar11;
  if (0 < iVar5) {
    paVar31 = &local_4f8.field_2;
    local_4d0 = (pointer)(local_578._40_8_ + 0x1a8);
    local_138 = &(((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_578._40_8_ + 0x1a8))->_M_t)._M_impl.super__Rb_tree_header._M_header;
    do {
      uVar7 = local_578._64_8_;
      local_478._0_8_ = local_478 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"_#","");
      plVar14 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_478,0,(char *)0x0,
                                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)(uVar7 + (long)iVar11 * 2 * 0x10))->_M_allocated_capacity);
      uVar7 = local_578._48_8_;
      puVar22 = (ulong *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar22) {
        local_4f8.field_2._M_allocated_capacity = *puVar22;
        local_4f8.field_2._8_8_ = plVar14[3];
        local_4f8._M_dataplus._M_p = (pointer)paVar31;
      }
      else {
        local_4f8.field_2._M_allocated_capacity = *puVar22;
        local_4f8._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_4f8._M_string_length = plVar14[1];
      *plVar14 = (long)puVar22;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      int32ToStr_abi_cxx11_(&local_498,(int32_t *)&local_280);
      uVar25 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != paVar31) {
        uVar25 = local_4f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar25 < local_498._M_string_length + local_4f8._M_string_length) {
        uVar25 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          uVar25 = local_498.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar25 < local_498._M_string_length + local_4f8._M_string_length)
        goto LAB_001a4cf7;
        plVar14 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_498,0,(char *)0x0,
                                     (ulong)local_4f8._M_dataplus._M_p);
      }
      else {
LAB_001a4cf7:
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_4f8,(ulong)local_498._M_dataplus._M_p);
      }
      local_588._0_8_ = local_578;
      pMVar24 = (pointer)(plVar14 + 2);
      if ((pointer)*plVar14 == pMVar24) {
        local_578._0_8_ = *(undefined8 *)pMVar24;
        local_578._8_4_ = (undefined4)plVar14[3];
        local_578._12_4_ = *(undefined4 *)((long)plVar14 + 0x1c);
      }
      else {
        local_578._0_8_ = *(undefined8 *)pMVar24;
        local_588._0_8_ = (pointer)*plVar14;
      }
      local_588._8_8_ = plVar14[1];
      *plVar14 = (long)pMVar24;
      plVar14[1] = 0;
      *(undefined1 *)&((_Alloc_hider *)&pMVar24->PlayList_playback_type)->_M_p = 0;
      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"_","");
      pMVar24 = (pointer)0xf;
      if ((pointer)local_588._0_8_ != (pointer)local_578) {
        pMVar24 = (pointer)local_578._0_8_;
      }
      pMVar3 = (pointer)((long)&((_Alloc_hider *)local_588._8_8_)->_M_p + local_4c0._M_string_length
                        );
      if (pMVar24 < pMVar3) {
        uVar25 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          uVar25 = local_4c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar25 < pMVar3) goto LAB_001a4de5;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_4c0,0,(char *)0x0,local_588._0_8_);
      }
      else {
LAB_001a4de5:
        puVar15 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)local_588,(ulong)local_4c0._M_dataplus._M_p);
      }
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 == paVar23) {
        local_408[0]._0_8_ = paVar23->_M_allocated_capacity;
        local_408[0]._8_8_ = puVar15[3];
        local_418._0_8_ = local_408;
      }
      else {
        local_408[0]._0_8_ = paVar23->_M_allocated_capacity;
        local_418._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar15;
      }
      local_418._8_8_ = puVar15[1];
      *puVar15 = paVar23;
      puVar15[1] = 0;
      paVar23->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p,
                        (ulong)(local_4c0.field_2._M_allocated_capacity + 1));
      }
      if ((pointer)local_588._0_8_ != (pointer)local_578) {
        operator_delete((void *)local_588._0_8_,(ulong)(local_578._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != paVar31) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_478._0_8_ != (pointer)(local_478 + 0x10)) {
        operator_delete((void *)local_478._0_8_,(ulong)(local_478._16_8_ + 1));
      }
      local_588._0_8_ = local_578;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"subClip","");
      cVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)uVar7,(string *)local_588);
      if ((pointer)local_588._0_8_ != (pointer)local_578) {
        operator_delete((void *)local_588._0_8_,(ulong)(local_578._0_8_ + 1));
      }
      if (cVar13._M_node == local_4c8) {
        local_588._0_8_ = local_578;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"_track_","");
        std::__cxx11::string::_M_append(local_418,local_588._0_8_);
      }
      else {
        local_588._0_8_ = local_578;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"_subtrack_","");
        std::__cxx11::string::_M_append(local_418,local_588._0_8_);
      }
      if ((pointer)local_588._0_8_ != (pointer)local_578) {
        operator_delete((void *)local_588._0_8_,(ulong)(local_578._0_8_ + 1));
      }
      int32ToStr_abi_cxx11_((string *)local_588,&local_590);
      std::__cxx11::string::_M_append(local_418,local_588._0_8_);
      if ((pointer)local_588._0_8_ != (pointer)local_578) {
        operator_delete((void *)local_588._0_8_,(ulong)(local_578._0_8_ + 1));
      }
      iVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_4d0,(key_type *)local_418);
      if (iVar16._M_node == local_138) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_4d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_578 + 0x40),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_578._64_8_ + (long)(int)local_280._M_dataplus._M_p * 2 * 0x10));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._0_8_ != local_408) {
        operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
      }
      iVar5 = (int)local_280._M_dataplus._M_p;
      iVar11 = (int)local_280._M_dataplus._M_p + -1;
      local_280._M_dataplus._M_p._0_4_ = iVar11;
    } while (0 < iVar5);
  }
  if (local_578._64_8_ == local_578._72_8_) {
    iVar11 = -1;
    goto LAB_001a6029;
  }
  local_578._104_8_ = (FileListIterator *)0x0;
  if (0x20 < (ulong)(local_578._72_8_ - local_578._64_8_)) {
    local_578._104_8_ = operator_new(0x28);
    (((FileListIterator *)local_578._104_8_)->super_FileNameIterator)._vptr_FileNameIterator =
         (_func_int **)&PTR_getNextName_abi_cxx11__00241300;
    (((FileListIterator *)local_578._104_8_)->m_files).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (((FileListIterator *)local_578._104_8_)->m_files).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (((FileListIterator *)local_578._104_8_)->m_files).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((FileListIterator *)local_578._104_8_)->m_index = 0;
    __position._M_current =
         (((vector<FileListIterator_*,_std::allocator<FileListIterator_*>_> *)
          (local_578._40_8_ + 0x50))->
         super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (((vector<FileListIterator_*,_std::allocator<FileListIterator_*>_> *)
         (local_578._40_8_ + 0x50))->
        super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<FileListIterator*,std::allocator<FileListIterator*>>::
      _M_realloc_insert<FileListIterator*const&>
                ((vector<FileListIterator*,std::allocator<FileListIterator*>> *)
                 (local_578._40_8_ + 0x50),__position,(FileListIterator **)(local_578 + 0x68));
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._64_8_;
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._72_8_;
    }
    else {
      *__position._M_current = (FileListIterator *)local_578._104_8_;
      pppFVar1 = &(((vector<FileListIterator_*,_std::allocator<FileListIterator_*>_> *)
                   (local_578._40_8_ + 0x50))->
                  super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._64_8_;
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._72_8_;
    }
    for (; paVar23 != paVar31;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar23->_M_local_buf + 0x20)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_578._104_8_ + 8),(value_type *)paVar23);
    }
  }
  uVar7 = local_578._40_8_;
  iVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
           ::find(&(((ContainerToReaderWrapper *)(local_578._40_8_ + 0x70))->m_demuxers)._M_t,
                  (key_type *)local_578._64_8_);
  if ((_Rb_tree_header *)iVar17._M_node ==
      &(((ContainerToReaderWrapper *)(uVar7 + 0x70))->m_demuxers)._M_t._M_impl.super__Rb_tree_header
     ) {
    File::File((File *)local_588);
    uVar7 = local_578._72_8_;
    pcVar28 = (pointer)0x0;
    if (local_578._64_8_ != local_578._72_8_) {
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._64_8_;
      do {
        iVar11 = File::open((File *)local_588,(char *)paVar31->_M_allocated_capacity,1,0);
        if ((char)iVar11 == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_418,"Can\'t open file: ",0x11);
          std::operator<<((ostream *)local_418,(char *)paVar31->_M_allocated_capacity);
          puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar21 = 0x1f6;
          *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
          if (local_1c0 == &local_1b0) {
            puVar21[6] = local_1b0;
            puVar21[7] = uStack_1ac;
            puVar21[8] = uStack_1a8;
            puVar21[9] = uStack_1a4;
          }
          else {
            *(uint **)(puVar21 + 2) = local_1c0;
            *(ulong *)(puVar21 + 6) = CONCAT44(uStack_1ac,local_1b0);
          }
          *(undefined8 *)(puVar21 + 4) = local_1b8;
          local_1b8 = 0;
          local_1b0 = local_1b0 & 0xffffff00;
          local_1c0 = &local_1b0;
          __cxa_throw(puVar21,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        local_418._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        piVar26 = (int64_t *)local_418;
        File::size((File *)local_588,(int64_t *)local_418);
        uVar25 = local_418._0_8_;
        File::close((File *)local_588,(int)piVar26);
        pcVar28 = pcVar28 + uVar25;
        paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar31->_M_local_buf + 0x20);
      } while (paVar31 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)uVar7);
    }
    File::~File((File *)local_588);
  }
  else {
    pcVar28 = (pointer)0x0;
  }
  uVar7 = local_578._48_8_;
  mergePlayItems((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)local_418,&local_438);
  pMVar18 = (pointer)createCodec(local_4a0,
                                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)uVar7,codecStreamName_00,
                                 (vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)local_418);
  std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::~vector
            ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)local_418);
  uVar7 = local_578._40_8_;
  local_578._56_8_ = pMVar18;
  (*(*(_func_int ***)&pMVar18->super_M2TSStreamInfo)[0xb])
            (pMVar18,(ulong)((int)((ulong)((long)(((vector<StreamInfo,_std::allocator<StreamInfo>_>
                                                    *)(local_578._40_8_ + 0x160))->
                                                 super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(((vector<StreamInfo,_std::allocator<StreamInfo>_> *
                                                  )(local_578._40_8_ + 0x160))->
                                                super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>
                                                )._M_impl.super__Vector_impl_data._M_start) >> 4) *
                             -0xf0f0f0f + 1));
  (*(*(_func_int ***)(M2TSStreamInfo *)local_578._56_8_)[0xc])
            (local_578._56_8_,((AbstractDemuxer *)uVar7)->m_timeOffset);
  if ((((vector<StreamInfo,_std::allocator<StreamInfo>_> *)(uVar7 + 0x160))->
      super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (((vector<StreamInfo,_std::allocator<StreamInfo>_> *)(uVar7 + 0x160))->
      super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar2 = (uint *)&((M2TSStreamInfo *)local_578._56_8_)->video_format;
    *puVar2 = *puVar2 | 1;
  }
  strToLowerCase((string *)local_588,(string *)local_578._64_8_);
  trimStr(&local_4f8,(string *)local_588);
  unquoteStr((string *)local_418,&local_4f8);
  std::__cxx11::string::operator=((string *)local_588,(string *)local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._0_8_ != local_408) {
    operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
  }
  paVar31 = &local_4f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar31) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  local_418._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,".h264","");
  bVar32 = strEndWith((string *)local_588,(string *)local_418);
  bVar10 = true;
  if (bVar32) {
LAB_001a5383:
    bVar9 = false;
  }
  else {
    local_4f8._M_dataplus._M_p = (pointer)paVar31;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,".264","");
    bVar9 = strEndWith((string *)local_588,&local_4f8);
    if (bVar9) goto LAB_001a5383;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,".mvc","");
    bVar10 = strEndWith((string *)local_588,(string *)local_478);
    bVar9 = true;
  }
  if ((bVar9) && ((pointer)local_478._0_8_ != (pointer)(local_478 + 0x10))) {
    operator_delete((void *)local_478._0_8_,(ulong)(local_478._16_8_ + 1));
  }
  if ((!bVar32) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar31)) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._0_8_ != local_408) {
    operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
  }
  this_00 = (ContainerToReaderWrapper *)(local_578._40_8_ + 0x70);
  local_578._96_8_ = this_00;
  if (bVar10 == false) {
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,".ts","");
    bVar32 = strEndWith((string *)local_588,(string *)local_418);
    bVar10 = true;
    if (bVar32) {
LAB_001a54fc:
      bVar6 = false;
      bVar9 = false;
    }
    else {
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,".m2ts","");
      bVar9 = strEndWith((string *)local_588,&local_498);
      if (bVar9) goto LAB_001a54fc;
      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,".mts","");
      bVar10 = strEndWith((string *)local_588,&local_4c0);
      if (bVar10) {
        bVar6 = true;
        bVar9 = false;
        bVar10 = true;
      }
      else {
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,".ssif","");
        bVar10 = strEndWith((string *)local_588,&local_280);
        bVar6 = true;
        bVar9 = true;
      }
    }
    if ((bVar9) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2)) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((bVar6) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2)) {
      operator_delete(local_4c0._M_dataplus._M_p,
                      (ulong)(local_4c0.field_2._M_allocated_capacity + 1));
    }
    if ((!bVar32) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2)) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._0_8_ != local_408) {
      operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
    }
    if (bVar10 == false) {
      local_418._0_8_ = local_408;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,".vob","");
      bVar32 = strEndWith((string *)local_588,(string *)local_418);
      bVar10 = true;
      if (bVar32) {
LAB_001a56ce:
        bVar9 = false;
      }
      else {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,".evo","");
        bVar9 = strEndWith((string *)local_588,&local_90);
        if (bVar9) goto LAB_001a56ce;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,".mpg","");
        bVar10 = strEndWith((string *)local_588,&local_b0);
        bVar9 = true;
      }
      if ((bVar9) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar32) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2)) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._0_8_ != local_408) {
        operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
      }
      if (bVar10 == false) {
        local_418._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,".mkv","");
        bVar32 = strEndWith((string *)local_588,(string *)local_418);
        bVar10 = true;
        if (bVar32) {
LAB_001a59dd:
          bVar9 = false;
        }
        else {
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,".mka","");
          bVar9 = strEndWith((string *)local_588,&local_2a0);
          if (bVar9) goto LAB_001a59dd;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,".mks","");
          bVar10 = strEndWith((string *)local_588,&local_d0);
          bVar9 = true;
        }
        if ((bVar9) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar32) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2)) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._0_8_ != local_408) {
          operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
        }
        if (bVar10 == false) {
          local_418._0_8_ = local_408;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_418,".mov","");
          bVar32 = strEndWith((string *)local_588,(string *)local_418);
          bVar10 = true;
          if (bVar32) {
LAB_001a5b6f:
            bVar6 = false;
            bVar9 = false;
          }
          else {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,".mp4","");
            bVar9 = strEndWith((string *)local_588,&local_f0);
            if (bVar9) goto LAB_001a5b6f;
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,".m4v","");
            bVar10 = strEndWith((string *)local_588,&local_130);
            if (bVar10) {
              bVar6 = true;
              bVar9 = false;
              bVar10 = true;
            }
            else {
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,".m4a","");
              bVar10 = strEndWith((string *)local_588,&local_110);
              bVar6 = true;
              bVar9 = true;
            }
          }
          if ((bVar9) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2)) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((bVar6) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2)) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((!bVar32) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._0_8_ != local_408) {
            operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
          }
          if (bVar10 == false) {
            local_578._96_8_ =
                 BufferedReaderManager::getReader
                           (*(BufferedReaderManager **)(local_578._40_8_ + 0x138),
                            *(char **)local_578._64_8_);
          }
          else {
            if (local_590 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_418,
                         "For streams inside MOV/MP4 container need track parameter.",0x3a);
              puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar21 = 0x1f6;
              *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
              if (local_240 == &local_230) {
                puVar21[6] = local_230;
                puVar21[7] = uStack_22c;
                puVar21[8] = uStack_228;
                puVar21[9] = uStack_224;
              }
              else {
                *(uint **)(puVar21 + 2) = local_240;
                *(ulong *)(puVar21 + 6) = CONCAT44(uStack_22c,local_230);
              }
              *(undefined8 *)(puVar21 + 4) = local_238;
              local_238 = 0;
              local_230 = local_230 & 0xffffff00;
              local_240 = &local_230;
              __cxa_throw(puVar21,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            if ((FileListIterator *)local_578._104_8_ != (FileListIterator *)0x0) {
              pCVar27 = (ContainerToReaderWrapper *)0x0;
              if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
                  (_func_int **)&PTR__ContainerToReaderWrapper_00241250) {
                pCVar27 = this_00;
              }
              ContainerToReaderWrapper::setFileIterator
                        (pCVar27,*(char **)local_578._64_8_,(FileNameIterator *)local_578._104_8_);
            }
            ((M2TSStreamInfo *)local_578._56_8_)->number_of_offset_sequences = ctMOV;
          }
        }
        else {
          if (local_590 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_418,"For streams inside MKV container need track parameter."
                       ,0x36);
            puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar21 = 0x1f6;
            *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
            if (local_220 == &local_210) {
              puVar21[6] = local_210;
              puVar21[7] = uStack_20c;
              puVar21[8] = uStack_208;
              puVar21[9] = uStack_204;
            }
            else {
              *(uint **)(puVar21 + 2) = local_220;
              *(ulong *)(puVar21 + 6) = CONCAT44(uStack_20c,local_210);
            }
            *(undefined8 *)(puVar21 + 4) = local_218;
            local_218 = 0;
            local_210 = local_210 & 0xffffff00;
            local_220 = &local_210;
            __cxa_throw(puVar21,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          if ((FileListIterator *)local_578._104_8_ != (FileListIterator *)0x0) {
            pCVar27 = (ContainerToReaderWrapper *)0x0;
            if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
                (_func_int **)&PTR__ContainerToReaderWrapper_00241250) {
              pCVar27 = this_00;
            }
            ContainerToReaderWrapper::setFileIterator
                      (pCVar27,*(char **)local_578._64_8_,(FileNameIterator *)local_578._104_8_);
          }
          ((M2TSStreamInfo *)local_578._56_8_)->number_of_offset_sequences = ctMKV;
        }
      }
      else {
        if (local_590 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_418,
                     "For streams inside MPG/VOB/EVO container need track parameter.",0x3e);
          puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar21 = 0x1f6;
          *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
          if (local_200 == &local_1f0) {
            puVar21[6] = local_1f0;
            puVar21[7] = uStack_1ec;
            puVar21[8] = uStack_1e8;
            puVar21[9] = uStack_1e4;
          }
          else {
            *(uint **)(puVar21 + 2) = local_200;
            *(ulong *)(puVar21 + 6) = CONCAT44(uStack_1ec,local_1f0);
          }
          *(undefined8 *)(puVar21 + 4) = local_1f8;
          local_1f8 = 0;
          local_1f0 = local_1f0 & 0xffffff00;
          local_200 = &local_1f0;
          __cxa_throw(puVar21,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        if ((FileListIterator *)local_578._104_8_ != (FileListIterator *)0x0) {
          pCVar27 = (ContainerToReaderWrapper *)0x0;
          if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
              (_func_int **)&PTR__ContainerToReaderWrapper_00241250) {
            pCVar27 = this_00;
          }
          ContainerToReaderWrapper::setFileIterator
                    (pCVar27,*(char **)local_578._64_8_,(FileNameIterator *)local_578._104_8_);
        }
        local_418._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,".evo","");
        bVar10 = strEndWith((string *)local_588,(string *)local_418);
        bVar32 = true;
        if (!bVar10) {
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,".evo\"","");
          bVar32 = strEndWith((string *)local_588,&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._0_8_ != local_408) {
          operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
        }
        if (bVar32 == false) {
          ((M2TSStreamInfo *)local_578._56_8_)->number_of_offset_sequences = ctVOB;
        }
        else {
          ((M2TSStreamInfo *)local_578._56_8_)->number_of_offset_sequences = ctEVOB;
        }
      }
    }
    else {
      if (local_590 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_418,"For streams inside TS/M2TS container need track parameter."
                   ,0x3a);
        puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar21 = 0x1f6;
        *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
        if (local_1e0 == &local_1d0) {
          puVar21[6] = local_1d0;
          puVar21[7] = uStack_1cc;
          puVar21[8] = uStack_1c8;
          puVar21[9] = uStack_1c4;
        }
        else {
          *(uint **)(puVar21 + 2) = local_1e0;
          *(ulong *)(puVar21 + 6) = CONCAT44(uStack_1cc,local_1d0);
        }
        *(undefined8 *)(puVar21 + 4) = local_1d8;
        local_1d8 = 0;
        local_1d0 = local_1d0 & 0xffffff00;
        local_1e0 = &local_1d0;
        __cxa_throw(puVar21,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      if ((FileListIterator *)local_578._104_8_ != (FileListIterator *)0x0) {
        pCVar27 = (ContainerToReaderWrapper *)0x0;
        if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
            (_func_int **)&PTR__ContainerToReaderWrapper_00241250) {
          pCVar27 = this_00;
        }
        ContainerToReaderWrapper::setFileIterator
                  (pCVar27,*(char **)local_578._64_8_,(FileNameIterator *)local_578._104_8_);
      }
      local_418._0_8_ = local_408;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,".ts","");
      bVar32 = strEndWith((string *)local_588,(string *)local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._0_8_ != local_408) {
        operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
      }
      if (bVar32) {
        ((M2TSStreamInfo *)local_578._56_8_)->number_of_offset_sequences = ctTS;
      }
      else {
        ((M2TSStreamInfo *)local_578._56_8_)->number_of_offset_sequences = ctM2TS;
      }
    }
  }
  else if (local_590 == 0) {
    local_578._96_8_ =
         BufferedReaderManager::getReader
                   (*(BufferedReaderManager **)(local_578._40_8_ + 0x138),*(char **)local_578._64_8_
                   );
  }
  else {
    ((M2TSStreamInfo *)local_578._56_8_)->number_of_offset_sequences = ctMultiH264;
    if ((FileListIterator *)local_578._104_8_ != (FileListIterator *)0x0) {
      ContainerToReaderWrapper::setFileIterator
                (this_00,*(char **)local_578._64_8_,(FileNameIterator *)local_578._104_8_);
    }
  }
  if ((BufferedReader *)local_578._96_8_ == (BufferedReader *)0x0) {
    if ((pointer)local_578._56_8_ != (pointer)0x0) {
      (*(*(_func_int ***)(M2TSStreamInfo *)local_578._56_8_)[1])();
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_418,
               "This version do not support multicast or other network steams for muxing",0x48);
    puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar21 = 0x1f6;
    *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
    if (local_260 == &local_250) {
      puVar21[6] = local_250;
      puVar21[7] = uStack_24c;
      puVar21[8] = uStack_248;
      puVar21[9] = uStack_244;
    }
    else {
      *(uint **)(puVar21 + 2) = local_260;
      *(ulong *)(puVar21 + 6) = CONCAT44(uStack_24c,local_250);
    }
    *(undefined8 *)(puVar21 + 4) = local_258;
    local_258 = 0;
    local_250 = local_250 & 0xffffff00;
    local_260 = &local_250;
    __cxa_throw(puVar21,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  std::vector<StreamInfo,std::allocator<StreamInfo>>::
  emplace_back<AbstractReader*&,AbstractStreamReader*&,std::__cxx11::string&,std::__cxx11::string_const&,int&,bool&>
            ((vector<StreamInfo,std::allocator<StreamInfo>> *)(local_578._40_8_ + 0x160),
             (AbstractReader **)(local_578 + 0x60),(AbstractStreamReader **)(local_578 + 0x38),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578._64_8_,
             local_140,&local_590,&local_589);
  uVar7 = local_578._40_8_;
  if ((FileListIterator *)local_578._104_8_ != (FileListIterator *)0x0) {
    if (((BufferedReader *)local_578._96_8_ == (BufferedReader *)0x0) ||
       (this_01 = (BufferedReader *)local_578._96_8_,
       ((AbstractReader *)local_578._96_8_)->_vptr_AbstractReader !=
       (_func_int **)&PTR__BufferedReader_0023fda0)) {
      this_01 = (BufferedReader *)0x0;
    }
    if (this_01 != (BufferedReader *)0x0) {
      BufferedReader::setFileIterator
                (this_01,(FileNameIterator *)local_578._104_8_,
                 (((vector<StreamInfo,_std::allocator<StreamInfo>_> *)(local_578._40_8_ + 0x160))->
                 super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1].m_readerID);
    }
  }
  pSVar4 = (((vector<StreamInfo,_std::allocator<StreamInfo>_> *)(uVar7 + 0x160))->
           super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_assign((string *)&pSVar4[-1].m_codec);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&pSVar4[-1].m_addParams._M_t,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_578._48_8_);
  if (((pointer)local_578._56_8_ == (pointer)0x0) ||
     (pMVar18 = (pointer)local_578._56_8_,
     *(_func_int ***)(M2TSStreamInfo *)local_578._56_8_ !=
     (_func_int **)&PTR__PGSStreamReader_002421d8)) {
    pMVar18 = (pointer)0x0;
  }
  iVar11 = *(int *)&(((M2TSStreamInfo *)local_578._56_8_)->m_index).
                    super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar18 != (pointer)0x0) {
    *(char *)&(pMVar18->pipParams).scaleIndex = (char)local_4d8;
    (pMVar18->pipParams).vOffset = local_578._116_4_;
    (pMVar18->pipParams).corner = local_578._124_4_;
    (pMVar18->pipParams).hOffset = local_578._120_4_;
  }
  local_418._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"timeshift","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_578._48_8_,(key_type *)local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._0_8_ != local_408) {
    operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
  }
  if (cVar13._M_node != local_4c8) {
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_418,*(long *)(cVar13._M_node + 2),
               (long)&(cVar13._M_node[2]._M_parent)->_M_color + *(long *)(cVar13._M_node + 2));
    lVar19 = std::__cxx11::string::find(local_418,0x20f76d,0);
    if (lVar19 == -1) {
      lVar19 = std::__cxx11::string::find((char)local_418,0x73);
      if (lVar19 == -1) {
        lVar19 = std::__cxx11::string::find(local_418,0x20fed9,0);
        if (lVar19 == -1) {
          iVar12 = strToInt32((char *)local_418._0_8_);
          goto LAB_001a5e4e;
        }
        std::__cxx11::string::substr((ulong)&local_458,(ulong)local_418);
        iVar12 = strToInt32((char *)local_458._M_allocated_capacity);
        if ((long *)local_458._M_allocated_capacity != local_448) {
          operator_delete((void *)local_458._M_allocated_capacity,local_448[0] + 1);
        }
        lVar19 = 1;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_458,(ulong)local_418);
        iVar12 = strToInt32((char *)local_458._M_allocated_capacity);
        if ((long *)local_458._M_allocated_capacity != local_448) {
          operator_delete((void *)local_458._M_allocated_capacity,local_448[0] + 1);
        }
        lVar19 = 1000000000;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&local_458,(ulong)local_418);
      iVar12 = strToInt32((char *)local_458._M_allocated_capacity);
      if ((long *)local_458._M_allocated_capacity != local_448) {
        operator_delete((void *)local_458._M_allocated_capacity,local_448[0] + 1);
      }
LAB_001a5e4e:
      lVar19 = 1000000;
    }
    lVar20 = ((iVar12 * lVar19) / 1000) * 0x14ac;
    pSVar4[-1].m_timeShift = lVar20;
    if (999 < iVar12 * lVar19) {
      pSVar4[-1].m_lastDTS = lVar20;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._0_8_ != local_408) {
      operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
    }
  }
  local_418._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"lang","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_578._48_8_,(key_type *)local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._0_8_ != local_408) {
    operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
  }
  uVar7 = local_578._40_8_;
  if (cVar13._M_node != local_4c8) {
    std::__cxx11::string::_M_assign((string *)&pSVar4[-1].m_lang);
  }
  *(int64_t *)(uVar7 + 0x128) = (int64_t)(pcVar28 + *(int64_t *)(uVar7 + 0x128));
  if ((pointer)local_588._0_8_ != (pointer)local_578) {
    operator_delete((void *)local_588._0_8_,(ulong)(local_578._0_8_ + 1));
  }
LAB_001a6029:
  std::vector<MPLSParser,_std::allocator<MPLSParser>_>::~vector(&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_578 + 0x40));
  return iVar11;
}

Assistant:

int METADemuxer::addStream(const string& codec, const string& codecStreamName, const map<string, string>& addParams)
{
    int32_t pid = 0;
    auto tmpitr = addParams.find("track");
    if (tmpitr != addParams.end())
        pid = strToInt32(tmpitr->second.c_str());

    tmpitr = addParams.find("subTrack");
    if (tmpitr != addParams.end())
        pid = SubTrackFilter::pidToSubPid(pid, strToInt32(tmpitr->second));

    vector<string> fileList;
    string unquotedStreamName = unquoteStr(codecStreamName);
    string fileExt = strToLowerCase(extractFileExt(codecStreamName));
    std::vector<MPLSParser> mplsInfoList;

    // filds for SS PG
    int leftEyeSubStreamIdx = -1;
    int rightEyeSubStreamIdx = -1;
    bool isSSPG = false;
    int ssPGOffset = 0xff;
    ////

    bool isSubStream = (codec == h264DepCodecInfo.programName) || addParams.find("subClip") != addParams.end();
    if (fileExt == "mpls" || fileExt == "mpl")
    {
        mplsInfoList = getMplsInfo(codecStreamName);
        vector<string> mplsNames = splitQuotedStr(codecStreamName.c_str(), '+');
        for (size_t k = 0; k < mplsInfoList.size(); ++k)
        {
            MPLSParser& mplsInfo = mplsInfoList[k];
            unquotedStreamName = unquoteStr(mplsNames[k]);
            for (size_t i = 0; i < mplsInfo.m_playItems.size(); ++i)
            {
                string playItemName;
                if (isSubStream)
                {
                    if (mplsInfo.m_mvcFiles.empty())
                    {
                        THROW(ERR_INVALID_CODEC_FORMAT,
                              "Current playlist file doesn't has MVC track info. Please, remove MVC track from the "
                              "track list")
                    }
                    if (mplsInfo.m_mvcFiles.size() <= i)
                        THROW(ERR_INVALID_CODEC_FORMAT,
                              "Bad playlist file: number of CLPI files for AVC and VMC parts do not match")
                    playItemName = mplsInfo.m_mvcFiles[i];
                }
                else
                {
                    playItemName = mplsInfo.m_playItems[i].fileName;
                }
                string fileName = mplsTrackToFullName(unquotedStreamName, playItemName);
                if (mplsInfo.isDependStreamExist && !fileExists(fileName))
                    fileName = mplsTrackToSSIFName(unquotedStreamName, mplsInfo.m_playItems[i].fileName);
                fileList.push_back(fileName);
            }

            MPLSStreamInfo streamInfo = mplsInfo.getStreamByPID(pid);
            if (streamInfo.stream_coding_type == StreamType::SUB_PGS && streamInfo.isSSPG)
            {
                // add refs to addition tracks for stereo subtitles
                leftEyeSubStreamIdx = addPGSubStream(codec, unquotedStreamName, addParams, streamInfo.leftEye);
                rightEyeSubStreamIdx = addPGSubStream(codec, unquotedStreamName, addParams, streamInfo.rightEye);

                isSSPG = streamInfo.isSSPG;
                ssPGOffset = streamInfo.SS_PG_offset_sequence_id;
            }
        }
    }
    else
    {
        fileList = extractFileList(codecStreamName);
    }

    for (int i = static_cast<int>(fileList.size()) - 1; i >= 0; --i)
    {
        string trackKey = fileList[i] + string("_#") + int32ToStr(i) + string("_");
        if (addParams.find("subClip") == addParams.end())
            trackKey += string("_track_");
        else
            trackKey += string("_subtrack_");
        trackKey += int32ToStr(pid);
        if (m_processedTracks.find(trackKey) != m_processedTracks.end())
            fileList.erase(fileList.begin() + i);
        else
            m_processedTracks.insert(trackKey);
    }
    if (fileList.empty())
        return -1;

    FileListIterator* listIterator = nullptr;
    if (fileList.size() > 1)
    {
        listIterator = new FileListIterator();
        m_iterators.push_back(listIterator);
        for (const string& fileName : fileList) listIterator->addFile(fileName);
    }

    int64_t fileSize = 0;

    if (m_containerReader.m_demuxers.find(fileList[0]) == m_containerReader.m_demuxers.end())
    {
        File tmpFile;
        for (const string& fileName : fileList)
        {
            if (!tmpFile.open(fileName.c_str(), File::ofRead))
                THROW(ERR_INVALID_CODEC_FORMAT, "Can't open file: " << fileName.c_str())
            int64_t tmpSize = 0;
            tmpFile.size(&tmpSize);
            fileSize += tmpSize;
            tmpFile.close();
        }
    }

    AbstractStreamReader* codecReader = createCodec(codec, addParams, fileList[0], mergePlayItems(mplsInfoList));
    codecReader->setStreamIndex(static_cast<int>(m_codecInfo.size() + 1));
    codecReader->setTimeOffset(m_timeOffset);

    if (m_codecInfo.empty())
        codecReader->m_flags |= AVPacket::PCR_STREAM;

    AbstractReader* dataReader;
    string tmpname = strToLowerCase(fileList[0]);
    tmpname = unquoteStr(trimStr(tmpname));

    if (strEndWith(tmpname, ".h264") || strEndWith(tmpname, ".264") || strEndWith(tmpname, ".mvc"))
    {
        if (pid)
        {
            dataReader = &m_containerReader;
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMultiH264);
            if (listIterator)
                dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        }
        else
        {
            dataReader = m_readManager.getReader(fileList[0].c_str());
        }
    }
    else if (strEndWith(tmpname, ".ts") || strEndWith(tmpname, ".m2ts") || strEndWith(tmpname, ".mts") ||
             strEndWith(tmpname, ".ssif"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside TS/M2TS container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        if (strEndWith(tmpname, ".ts"))
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctTS);
        else
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctM2TS);
    }
    else if (strEndWith(tmpname, ".vob") || strEndWith(tmpname, ".evo") || strEndWith(tmpname, ".mpg"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MPG/VOB/EVO container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        if (strEndWith(tmpname, ".evo") || strEndWith(tmpname, ".evo\""))
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctEVOB);
        else
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctVOB);
    }
    else if (strEndWith(tmpname, ".mkv") || strEndWith(tmpname, ".mka") || strEndWith(tmpname, ".mks"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MKV container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMKV);
    }
    else if (strEndWith(tmpname, ".mov") || strEndWith(tmpname, ".mp4") || strEndWith(tmpname, ".m4v") ||
             strEndWith(tmpname, ".m4a"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MOV/MP4 container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMOV);
    }
    else
    {
        dataReader = m_readManager.getReader(fileList[0].c_str());
    }
    if (dataReader == nullptr)
    {
        delete codecReader;
        THROW(ERR_INVALID_CODEC_FORMAT, "This version do not support multicast or other network steams for muxing")
    }

    m_codecInfo.emplace_back(dataReader, codecReader, fileList[0], codecStreamName, pid, isSubStream);
    if (listIterator)
    {
        auto fileReader = dynamic_cast<BufferedFileReader*>(dataReader);
        if (fileReader)
            fileReader->setFileIterator(listIterator, m_codecInfo.rbegin()->m_readerID);
    }

    StreamInfo& streamInfo = *m_codecInfo.rbegin();
    streamInfo.m_codec = codec;
    streamInfo.m_addParams = addParams;
    int streamIndex = codecReader->getStreamIndex();

    // fields for SS PG stream
    auto pgStream = dynamic_cast<PGSStreamReader*>(codecReader);
    if (pgStream)
    {
        pgStream->isSSPG = isSSPG;
        pgStream->ssPGOffset = ssPGOffset;
        pgStream->leftEyeSubStreamIdx = leftEyeSubStreamIdx;
        pgStream->rightEyeSubStreamIdx = rightEyeSubStreamIdx;
    }
    //

    auto itr = addParams.find("timeshift");
    if (itr != addParams.end())
    {
        string timeShift = itr->second;
        size_t pos = 0;
        int64_t coeff = 1;
        int64_t value = 0;
        if ((pos = timeShift.find("ms")) != std::string::npos)
        {
            coeff = 1000000;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else if ((pos = timeShift.find('s')) != std::string::npos)
        {
            coeff = 1000000000;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else if ((pos = timeShift.find("ns")) != std::string::npos)
        {
            coeff = 1;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else
        {
            coeff = 1000000;
            value = strToInt32(timeShift.c_str());
        }
        value = value * coeff / 1000 * INTERNAL_PTS_FREQ / 1000000;
        streamInfo.m_timeShift = value;
        if (value > 0)
            streamInfo.m_lastDTS = value;
    }

    itr = addParams.find("lang");
    if (itr != addParams.end())
        streamInfo.m_lang = itr->second;
    m_totalSize += fileSize;

    return streamIndex;
}